

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::TypeInNameSpace
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,Definition *def,string *suffix)

{
  Namespace *ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *suffix_local;
  Definition *def_local;
  KotlinKMPGenerator *this_local;
  
  ns = def->defined_namespace;
  local_28 = suffix;
  suffix_local = &def->name;
  def_local = (Definition *)this;
  this_local = (KotlinKMPGenerator *)__return_storage_ptr__;
  std::operator+(&local_48,&def->name,suffix);
  TypeInNameSpace(__return_storage_ptr__,this,ns,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeInNameSpace(const Definition &def,
                              const std::string &suffix = "") const {
    return TypeInNameSpace(def.defined_namespace, def.name + suffix);
  }